

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stair_shuffle.c
# Opt level: O0

void stair_shuffle(dw_rom *rom)

{
  dw_rom *rom_local;
  
  stair_shuffle_init(rom);
  if ((rom->flags[2] & 0xc) != 0) {
    printf("Shuffling stairs...\n");
    do_shuffle(rom);
    code_patches(rom);
    write_back_warps(rom);
  }
  chest_paths(rom);
  return;
}

Assistant:

void stair_shuffle(dw_rom *rom)
{

    stair_shuffle_init(rom);
    if (STAIR_SHUFFLE(rom)) {
        printf("Shuffling stairs...\n");
        do_shuffle(rom);
        code_patches(rom);
        write_back_warps(rom);
    }
    chest_paths(rom);

}